

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::AddGenerators
          (MessageGenerator *this,
          vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
          *enum_generators,
          vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
          *extension_generators)

{
  pointer *pppEVar1;
  pointer *pppEVar2;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  iterator __position_02;
  ExtensionGenerator *pEVar3;
  pointer puVar4;
  pointer puVar5;
  long lVar6;
  long lVar7;
  Descriptor *pDVar8;
  _Head_base<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_false> local_38;
  
  pDVar8 = this->descriptor_;
  if (0 < *(int *)(pDVar8 + 0x78)) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      pEVar3 = (ExtensionGenerator *)operator_new(0x68);
      EnumGenerator::EnumGenerator
                ((EnumGenerator *)pEVar3,(EnumDescriptor *)(*(long *)(pDVar8 + 0x40) + lVar7),
                 &this->variables_,&this->options_);
      __position._M_current =
           (enum_generators->
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (enum_generators->
          super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_38._M_head_impl = pEVar3;
        std::
        vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::EnumGenerator*>
                  ((vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
                    *)enum_generators,__position,(EnumGenerator **)&local_38);
        puVar4 = (enum_generators->
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        ((__position._M_current)->_M_t).
        super___uniq_ptr_impl<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
        .super__Head_base<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_false>._M_head_impl
             = (EnumGenerator *)pEVar3;
        puVar4 = (enum_generators->
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1;
        (enum_generators->
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = puVar4;
      }
      local_38._M_head_impl =
           (ExtensionGenerator *)
           puVar4[-1]._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
           .super__Head_base<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_false>.
           _M_head_impl;
      __position_00._M_current =
           (this->enum_generators_).
           super__Vector_base<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->enum_generators_).
          super__Vector_base<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::compiler::cpp::EnumGenerator_const*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator_const*>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::EnumGenerator_const*>
                  ((vector<google::protobuf::compiler::cpp::EnumGenerator_const*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator_const*>>
                    *)&this->enum_generators_,__position_00,(EnumGenerator **)&local_38);
      }
      else {
        *__position_00._M_current = (EnumGenerator *)local_38._M_head_impl;
        pppEVar1 = &(this->enum_generators_).
                    super__Vector_base<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + 1;
      }
      lVar6 = lVar6 + 1;
      pDVar8 = this->descriptor_;
      lVar7 = lVar7 + 0x50;
    } while (lVar6 < *(int *)(pDVar8 + 0x78));
  }
  if (0 < *(int *)(pDVar8 + 0x80)) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      pEVar3 = (ExtensionGenerator *)operator_new(0xf8);
      ExtensionGenerator::ExtensionGenerator
                (pEVar3,(FieldDescriptor *)(*(long *)(pDVar8 + 0x50) + lVar7),&this->options_);
      __position_01._M_current =
           (extension_generators->
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position_01._M_current ==
          (extension_generators->
          super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_38._M_head_impl = pEVar3;
        std::
        vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::ExtensionGenerator*>
                  ((vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
                    *)extension_generators,__position_01,&local_38._M_head_impl);
        puVar5 = (extension_generators->
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        ((__position_01._M_current)->_M_t).
        super___uniq_ptr_impl<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
        ._M_t.
        super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
        .super__Head_base<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_false>.
        _M_head_impl = pEVar3;
        puVar5 = (extension_generators->
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1;
        (extension_generators->
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish = puVar5;
      }
      local_38._M_head_impl =
           puVar5[-1]._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
           .super__Head_base<0UL,_google::protobuf::compiler::cpp::ExtensionGenerator_*,_false>.
           _M_head_impl;
      __position_02._M_current =
           (this->extension_generators_).
           super__Vector_base<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_02._M_current ==
          (this->extension_generators_).
          super__Vector_base<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::compiler::cpp::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_const*>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::ExtensionGenerator_const*>
                  ((vector<google::protobuf::compiler::cpp::ExtensionGenerator_const*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_const*>>
                    *)&this->extension_generators_,__position_02,&local_38._M_head_impl);
      }
      else {
        *__position_02._M_current = local_38._M_head_impl;
        pppEVar2 = &(this->extension_generators_).
                    super__Vector_base<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + 1;
      }
      lVar6 = lVar6 + 1;
      pDVar8 = this->descriptor_;
      lVar7 = lVar7 + 0x98;
    } while (lVar6 < *(int *)(pDVar8 + 0x80));
  }
  return;
}

Assistant:

void MessageGenerator::AddGenerators(
    std::vector<std::unique_ptr<EnumGenerator>>* enum_generators,
    std::vector<std::unique_ptr<ExtensionGenerator>>* extension_generators) {
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators->emplace_back(
        new EnumGenerator(descriptor_->enum_type(i), variables_, options_));
    enum_generators_.push_back(enum_generators->back().get());
  }
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators->emplace_back(
        new ExtensionGenerator(descriptor_->extension(i), options_));
    extension_generators_.push_back(extension_generators->back().get());
  }
}